

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ShutdownData::~ShutdownData(ShutdownData *this)

{
  pointer ppVar1;
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  *__range3;
  pointer ppVar2;
  
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::pair<void(*)(void_const*),void_const*>*,std::vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>>>
            ((this->functions).
             super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->functions).
             super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  ppVar1 = (this->functions).
           super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (this->functions).
                super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    (*ppVar2->first)(ppVar2->second);
  }
  std::
  _Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
                   *)this);
  return;
}

Assistant:

~ShutdownData() {
    std::reverse(functions.begin(), functions.end());
    for (auto pair : functions) pair.first(pair.second);
  }